

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O0

void OpenMesh::IO::assignCustomProperty<float>
               (istream *_in,BaseImporter *_bi,VertexHandle _vh,string *_propName)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference pvVar3;
  value_type local_30;
  BaseHandle local_2c;
  float in;
  VPropHandleT<float> prop;
  string *_propName_local;
  BaseImporter *_bi_local;
  istream *_in_local;
  VertexHandle _vh_local;
  
  _in = _propName;
  VPropHandleT<float>::VPropHandleT((VPropHandleT<float> *)&local_2c,-1);
  iVar2 = (*_bi->_vptr_BaseImporter[0x19])();
  bVar1 = BaseKernel::get_property_handle<float>
                    ((BaseKernel *)CONCAT44(extraout_var,iVar2),(VPropHandleT<float> *)&local_2c,_in
                    );
  if (!bVar1) {
    iVar2 = (*_bi->_vptr_BaseImporter[0x19])();
    BaseKernel::add_property<float>
              ((BaseKernel *)CONCAT44(extraout_var_00,iVar2),(VPropHandleT<float> *)&local_2c,_in);
  }
  std::istream::operator>>(_in,&local_30);
  iVar2 = (*_bi->_vptr_BaseImporter[0x19])();
  pvVar3 = BaseKernel::property<float>
                     ((BaseKernel *)CONCAT44(extraout_var_01,iVar2),
                      (VPropHandleT<float>)local_2c.idx_,_vh);
  *pvVar3 = local_30;
  return;
}

Assistant:

void assignCustomProperty(std::istream& _in, BaseImporter& _bi, VertexHandle _vh, const std::string& _propName)
{
  OpenMesh::VPropHandleT<T> prop;
  if (!_bi.kernel()->get_property_handle(prop,_propName))
    _bi.kernel()->add_property(prop,_propName);
  T in;
  _in >> in;
  _bi.kernel()->property(prop,_vh) = in;
}